

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int base64_decode_quartet_using_maps(base64_maps_t *maps,char *dest,char *src)

{
  int8_t iVar1;
  int8_t iVar2;
  int8_t iVar3;
  byte bVar4;
  char d;
  char c;
  char b;
  char a;
  char *src_local;
  char *dest_local;
  base64_maps_t *maps_local;
  
  iVar1 = sixbit_from_b64(maps,*src);
  iVar2 = sixbit_from_b64(maps,src[1]);
  iVar3 = sixbit_from_b64(maps,src[2]);
  bVar4 = sixbit_from_b64(maps,src[3]);
  if ((((iVar1 == -1) || (iVar2 == -1)) || (iVar3 == -1)) || (bVar4 == 0xff)) {
    maps_local._4_4_ = -1;
  }
  else {
    *dest = iVar1 << 2 | iVar2 >> 4;
    dest[1] = iVar2 << 4 | iVar3 >> 2;
    dest[2] = iVar3 << 6 | bVar4;
    maps_local._4_4_ = 0;
  }
  return maps_local._4_4_;
}

Assistant:

int base64_decode_quartet_using_maps(const base64_maps_t *maps, char dest[3],
				     const char src[4])
{
	signed char a;
	signed char b;
	signed char c;
	signed char d;

	a = sixbit_from_b64(maps, src[0]);
	b = sixbit_from_b64(maps, src[1]);
	c = sixbit_from_b64(maps, src[2]);
	d = sixbit_from_b64(maps, src[3]);

	if ((a == -1) || (b == -1) || (c == -1) || (d == -1)) {
		return -1;
	}

	dest[0] = (a << 2) | (b >> 4);
	dest[1] = ((b & 0xf) << 4) | (c >> 2);
	dest[2] = ((c & 0x3) << 6) | d;

	return 0;
}